

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkMakeOnePo(Abc_Ntk_t *pNtkInit,int Output,int nRange)

{
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *pVec;
  Abc_Obj_t *pAVar1;
  Vec_Ptr_t *p;
  int iVar2;
  char *__s;
  int i;
  
  if (pNtkInit->ntkType == ABC_NTK_NETLIST) {
    __assert_fail("!Abc_NtkIsNetlist(pNtkInit)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNtk.c"
                  ,0x675,"Abc_Ntk_t *Abc_NtkMakeOnePo(Abc_Ntk_t *, int, int)");
  }
  if (pNtkInit->nObjCounts[8] == pNtkInit->vBoxes->nSize) {
    if ((Output < 0) || (pNtkInit->vPos->nSize <= Output)) {
      puts("PO index is incorrect.");
      pNtk = (Abc_Ntk_t *)0x0;
    }
    else {
      pNtk = Abc_NtkDup(pNtkInit);
      if (pNtk->vPos->nSize != 1) {
        iVar2 = 1;
        if (1 < nRange) {
          iVar2 = nRange;
        }
        pVec = Vec_PtrAlloc(iVar2);
        for (i = 0; i < pNtk->vPos->nSize; i = i + 1) {
          pAVar1 = Abc_NtkPo(pNtk,i);
          if (i < Output || iVar2 + Output <= i) {
            Abc_NtkDeleteObjPo(pAVar1);
          }
          else {
            Vec_PtrPush(pVec,pAVar1);
          }
        }
        p = Vec_PtrDup(pVec);
        for (iVar2 = pNtk->vPos->nSize; iVar2 < pNtk->vCos->nSize; iVar2 = iVar2 + 1) {
          pAVar1 = Abc_NtkCo(pNtk,iVar2);
          Vec_PtrPush(p,pAVar1);
        }
        Vec_PtrFree(pNtk->vPos);
        pNtk->vPos = pVec;
        Vec_PtrFree(pNtk->vCos);
        pNtk->vCos = p;
        if (pNtk->ntkType == ABC_NTK_STRASH) {
          Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
          __s = "Run sequential cleanup (\"scl\") to get rid of dangling logic.";
        }
        else {
          __s = "Run sequential cleanup (\"st; scl\") to get rid of dangling logic.";
        }
        puts(__s);
        iVar2 = Abc_NtkCheck(pNtk);
        if (iVar2 == 0) {
          fwrite("Abc_NtkMakeComb(): Network check has failed.\n",0x2d,1,_stdout);
        }
      }
    }
    return pNtk;
  }
  __assert_fail("Abc_NtkHasOnlyLatchBoxes(pNtkInit)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNtk.c"
                ,0x676,"Abc_Ntk_t *Abc_NtkMakeOnePo(Abc_Ntk_t *, int, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkMakeOnePo( Abc_Ntk_t * pNtkInit, int Output, int nRange )
{
    Abc_Ntk_t * pNtk;
    Vec_Ptr_t * vPosLeft;
    Vec_Ptr_t * vCosLeft;
    Abc_Obj_t * pNodePo;
    int i;
    assert( !Abc_NtkIsNetlist(pNtkInit) );
    assert( Abc_NtkHasOnlyLatchBoxes(pNtkInit) );
    if ( Output < 0 || Output >= Abc_NtkPoNum(pNtkInit) )
    {
        printf( "PO index is incorrect.\n" );
        return NULL;
    }

    pNtk = Abc_NtkDup( pNtkInit );
    if ( Abc_NtkPoNum(pNtk) == 1 )
        return pNtk;

    if ( nRange < 1 )
        nRange = 1;

    // filter POs
    vPosLeft = Vec_PtrAlloc( nRange );
    Abc_NtkForEachPo( pNtk, pNodePo, i )
        if ( i < Output || i >= Output + nRange )
            Abc_NtkDeleteObjPo( pNodePo );
        else
            Vec_PtrPush( vPosLeft, pNodePo );
    // filter COs
    vCosLeft = Vec_PtrDup( vPosLeft );
    for ( i = Abc_NtkPoNum(pNtk); i < Abc_NtkCoNum(pNtk); i++ )
        Vec_PtrPush( vCosLeft, Abc_NtkCo(pNtk, i) );
    // update arrays
    Vec_PtrFree( pNtk->vPos );  pNtk->vPos = vPosLeft;
    Vec_PtrFree( pNtk->vCos );  pNtk->vCos = vCosLeft;

    // clean the network
    if ( Abc_NtkIsStrash(pNtk) )
    {
        Abc_AigCleanup( (Abc_Aig_t *)pNtk->pManFunc );
        printf( "Run sequential cleanup (\"scl\") to get rid of dangling logic.\n" );
    }
    else
    {
        printf( "Run sequential cleanup (\"st; scl\") to get rid of dangling logic.\n" );
    }

    if ( !Abc_NtkCheck( pNtk ) )
        fprintf( stdout, "Abc_NtkMakeComb(): Network check has failed.\n" );
    return pNtk;
}